

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTRealTraffic.cpp
# Opt level: O0

string * __thiscall RealTrafficConnection::GetStatusText_abi_cxx11_(RealTrafficConnection *this)

{
  bool bVar1;
  uint uVar2;
  undefined8 uVar3;
  RealTrafficConnection *in_RSI;
  char *pcVar4;
  string *in_RDI;
  double dVar5;
  char sIntvl [100];
  string *s;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  char *in_stack_fffffffffffffea8;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  RealTrafficConnection *in_stack_fffffffffffffed8;
  string local_100 [8];
  LTChannel *in_stack_ffffffffffffff08;
  string local_e0 [38];
  undefined1 local_ba;
  allocator<char> local_b9;
  string local_b8 [32];
  undefined4 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6c;
  byte bVar6;
  allocator<char> in_stack_ffffffffffffff6d;
  undefined1 in_stack_ffffffffffffff6e;
  byte bVar7;
  allocator<char> in_stack_ffffffffffffff6f;
  allocator<char> local_8f;
  byte local_8e;
  allocator<char> local_8d [18];
  byte local_7b;
  allocator<char> local_7a;
  undefined1 local_79;
  char local_78 [120];
  
  uVar2 = (*(in_RSI->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
            _vptr_LTChannel[6])();
  if (((uVar2 & 1) == 0) ||
     (uVar2 = (*(in_RSI->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                _vptr_LTChannel[10])(), (uVar2 & 1) == 0)) {
    LTChannel::GetStatusText_abi_cxx11_(in_stack_ffffffffffffff08);
  }
  else if (in_RSI->eConnType == RT_CONN_REQU_REPL) {
    local_79 = 0;
    local_7b = 0;
    local_8e = 0;
    bVar1 = false;
    bVar7 = 0;
    bVar6 = 0;
    if ((in_RSI->curr).eRequType == RT_REQU_AUTH) {
      std::allocator<char>::allocator();
      local_7b = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
    }
    else if ((in_RSI->curr).eRequType == RT_REQU_DEAUTH) {
      std::allocator<char>::allocator();
      local_8e = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
    }
    else if ((in_RSI->curr).eRequType == RT_REQU_PARKED) {
      std::allocator<char>::allocator();
      bVar1 = true;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
    }
    else if ((in_RSI->curr).eRequType == RT_REQU_NEAREST_METAR) {
      std::allocator<char>::allocator();
      bVar7 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
    }
    else if ((in_RSI->curr).eRequType == RT_REQU_WEATHER) {
      std::allocator<char>::allocator();
      bVar6 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
    }
    else {
      LTChannel::GetStatusText_abi_cxx11_(in_stack_ffffffffffffff08);
    }
    if ((bVar6 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6d);
    }
    if ((bVar7 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
    }
    if (bVar1) {
      std::allocator<char>::~allocator(&local_8f);
    }
    if ((local_8e & 1) != 0) {
      std::allocator<char>::~allocator(local_8d);
    }
    if ((local_7b & 1) != 0) {
      std::allocator<char>::~allocator(&local_7a);
    }
    bVar1 = isHistoric(in_RSI);
    if (bVar1) {
      pcVar4 = local_78;
      GetAdjustTSText_abi_cxx11_
                ((RealTrafficConnection *)
                 CONCAT17(in_stack_ffffffffffffff6f,
                          CONCAT16(bVar7,CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(bVar6,in_stack_ffffffffffffff68)))));
      this_00 = local_b8;
      uVar3 = std::__cxx11::string::c_str();
      snprintf(pcVar4,100," | historic traffic from %s",uVar3);
      std::__cxx11::string::~string(this_00);
      std::__cxx11::string::operator+=((string *)in_RDI,local_78);
    }
    if (in_RSI->lTotalFlights == 0) {
      std::__cxx11::string::operator+=((string *)in_RDI," | RealTraffic has no traffic at all! ");
      bVar1 = isHistoric(in_RSI);
      pcVar4 = "(full_count=0)";
      if (bVar1) {
        pcVar4 = "Maybe requested historic data too far in the past?";
      }
      std::__cxx11::string::operator+=((string *)in_RDI,pcVar4);
    }
  }
  else if (in_RSI->status == RT_STATUS_NONE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
    std::allocator<char>::~allocator(&local_b9);
  }
  else if ((in_RSI->status == RT_STATUS_STARTING) || (in_RSI->status == RT_STATUS_STOPPING)) {
    GetStatusStr_abi_cxx11_(in_stack_fffffffffffffed8);
  }
  else {
    local_ba = 0;
    LTChannel::GetStatusText_abi_cxx11_(in_stack_ffffffffffffff08);
    std::__cxx11::string::operator+=((string *)in_RDI," | ");
    GetStatusStr_abi_cxx11_(in_stack_fffffffffffffed8);
    std::__cxx11::string::operator+=((string *)in_RDI,local_e0);
    std::__cxx11::string::~string(local_e0);
    bVar1 = IsConnected(in_RSI);
    if ((bVar1) && (0.0 < in_RSI->lastReceivedTime)) {
      dVar5 = DataRefs::GetSimTime(&dataRefs);
      snprintf(local_78,100," | last msg %.0fs ago",dVar5 - in_RSI->lastReceivedTime);
      std::__cxx11::string::operator+=((string *)in_RDI,local_78);
      if (1.0 < in_RSI->tsAdjust) {
        GetAdjustTSText_abi_cxx11_
                  ((RealTrafficConnection *)
                   CONCAT17(in_stack_ffffffffffffff6f,
                            CONCAT16(in_stack_ffffffffffffff6e,
                                     CONCAT15(in_stack_ffffffffffffff6d,
                                              CONCAT14(in_stack_ffffffffffffff6c,
                                                       in_stack_ffffffffffffff68)))));
        uVar3 = std::__cxx11::string::c_str();
        snprintf(local_78,100," | historic traffic from %s",uVar3);
        std::__cxx11::string::~string(local_100);
        std::__cxx11::string::operator+=((string *)in_RDI,local_78);
      }
    }
  }
  return in_RDI;
}

Assistant:

std::string RealTrafficConnection::GetStatusText () const
{
    char sIntvl[100];

    // Invalid or disabled/off?
    if (!IsValid() || !IsEnabled())
        return LTChannel::GetStatusText();

    // --- Direct Connection? ---
    if (eConnType == RT_CONN_REQU_REPL) {
        std::string s =
            curr.eRequType == CurrTy::RT_REQU_AUTH          ? "Authenticating..." :
            curr.eRequType == CurrTy::RT_REQU_DEAUTH        ? "De-authenticating..." :
            curr.eRequType == CurrTy::RT_REQU_PARKED        ? "Fetching parked aircraft..." :
            curr.eRequType == CurrTy::RT_REQU_NEAREST_METAR ? "Fetching weather..." :
            curr.eRequType == CurrTy::RT_REQU_WEATHER       ? "Fetching weather..." :
            LTChannel::GetStatusText();
        if (isHistoric()) {                             // historic data?
            snprintf(sIntvl, sizeof(sIntvl), MSG_RT_ADJUST,
                     GetAdjustTSText().c_str());
            s += sIntvl;
        }
        if (lTotalFlights == 0) {                       // RealTraffic has no data at all???
            s += " | RealTraffic has no traffic at all! ";
            s += (isHistoric() ? "Maybe requested historic data too far in the past?" : "(full_count=0)");
        }
        return s;
    }
    
    // --- UDP/TCP connection ---
    // If we are waiting to establish a connection then we return RT-specific texts
    if (status == RT_STATUS_NONE)           return "Starting...";
    if (status == RT_STATUS_STARTING ||
        status == RT_STATUS_STOPPING)
        return GetStatusStr();
    
    // An active source of tracking data...for how many aircraft?
    std::string s = LTChannel::GetStatusText();
    // Add extended information specifically on RealTraffic connection status
    s += " | ";
    s += GetStatusStr();
    if (IsConnected() && lastReceivedTime > 0.0) {
        // add when the last msg was received
        snprintf(sIntvl,sizeof(sIntvl),MSG_RT_LAST_RCVD,
                 dataRefs.GetSimTime() - lastReceivedTime);
        s += sIntvl;
        // if receiving historic traffic say so
        if (tsAdjust > 1.0) {
            snprintf(sIntvl, sizeof(sIntvl), MSG_RT_ADJUST,
                     GetAdjustTSText().c_str());
            s += sIntvl;
        }
    }
    return s;
}